

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_getbits.c
# Opt level: O0

void get_bits_testv6(void)

{
  undefined1 auVar1 [8];
  undefined8 uVar2;
  char buf [46];
  undefined8 local_bc;
  lrtr_ip_addr local_b0;
  lrtr_ip_addr local_9c;
  lrtr_ip_addr local_88;
  lrtr_ip_addr local_74;
  lrtr_ip_addr local_60;
  lrtr_ip_addr local_4c;
  undefined1 local_38 [8];
  lrtr_ip_addr result;
  lrtr_ip_addr addr;
  
  result.u.addr6.addr[2] = 1;
  result.u.addr6.addr[3] = 0x22aabbcc;
  lrtr_ip_addr_get_bits(&local_4c,(lrtr_ip_addr *)((long)&result.u + 8),'\0',0x80);
  local_38 = (undefined1  [8])local_4c._0_8_;
  auVar1 = local_38;
  result._0_8_ = local_4c.u._4_8_;
  uVar2 = result._0_8_;
  result.u.addr6.addr[1] = local_4c.u.addr6.addr[3];
  local_38._4_4_ = local_4c.u._0_4_;
  local_38 = auVar1;
  result._0_8_ = uVar2;
  if ((((local_38._4_4_ != result.u.addr6.addr[3]) ||
       (result.ver = (lrtr_ip_version)local_4c.u._4_8_, result.ver != 0xddeeff99)) ||
      (result.u.addr6.addr[0] = (uint32_t)((ulong)local_4c.u._4_8_ >> 0x20),
      result.u.addr6.addr[0] != 0x33001122)) || (local_4c.u.addr6.addr[3] != 0x33445566)) {
    __assert_fail("result.u.addr6.addr[0] == addr.u.addr6.addr[0] && result.u.addr6.addr[1] == addr.u.addr6.addr[1] && result.u.addr6.addr[2] == addr.u.addr6.addr[2] && result.u.addr6.addr[3] == addr.u.addr6.addr[3]"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_getbits.c"
                  ,100,"void get_bits_testv6(void)");
  }
  lrtr_ip_addr_get_bits(&local_60,(lrtr_ip_addr *)((long)&result.u + 8),'\0','@');
  local_38 = (undefined1  [8])local_60._0_8_;
  auVar1 = local_38;
  result._0_8_ = local_60.u._4_8_;
  uVar2 = result._0_8_;
  result.u.addr6.addr[1] = local_60.u.addr6.addr[3];
  local_38._4_4_ = local_60.u._0_4_;
  local_38 = auVar1;
  result._0_8_ = uVar2;
  if (((local_38._4_4_ != result.u.addr6.addr[3]) ||
      (result.ver = (lrtr_ip_version)local_60.u._4_8_, result.ver != 0xddeeff99)) ||
     ((result.u.addr6.addr[0] = (uint32_t)((ulong)local_60.u._4_8_ >> 0x20),
      result.u.addr6.addr[0] != 0 || (local_60.u.addr6.addr[3] != 0)))) {
    __assert_fail("result.u.addr6.addr[0] == addr.u.addr6.addr[0] && result.u.addr6.addr[1] == addr.u.addr6.addr[1] && result.u.addr6.addr[2] == 0 && result.u.addr6.addr[3] == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_getbits.c"
                  ,0x68,"void get_bits_testv6(void)");
  }
  memset(local_38,0,0x14);
  lrtr_ip_addr_get_bits(&local_74,(lrtr_ip_addr *)((long)&result.u + 8),'@','@');
  local_38 = (undefined1  [8])local_74._0_8_;
  auVar1 = local_38;
  result._0_8_ = local_74.u._4_8_;
  uVar2 = result._0_8_;
  result.u.addr6.addr[1] = local_74.u.addr6.addr[3];
  local_38._4_4_ = local_74.u._0_4_;
  local_38 = auVar1;
  if (local_38._4_4_ != 0) {
    __assert_fail("result.u.addr6.addr[0] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_getbits.c"
                  ,0x6c,"void get_bits_testv6(void)");
  }
  result.ver = (lrtr_ip_version)local_74.u._4_8_;
  result._0_8_ = uVar2;
  if (result.ver != LRTR_IPV4) {
    __assert_fail("result.u.addr6.addr[1] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_getbits.c"
                  ,0x6d,"void get_bits_testv6(void)");
  }
  result.u.addr6.addr[0] = (uint32_t)((ulong)local_74.u._4_8_ >> 0x20);
  if (result.u.addr6.addr[0] != 0x33001122) {
    __assert_fail("result.u.addr6.addr[2] == addr.u.addr6.addr[2]",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_getbits.c"
                  ,0x6e,"void get_bits_testv6(void)");
  }
  if (local_74.u.addr6.addr[3] == 0x33445566) {
    lrtr_ip_addr_get_bits(&local_88,(lrtr_ip_addr *)((long)&result.u + 8),'\0','\b');
    local_38 = (undefined1  [8])local_88._0_8_;
    auVar1 = local_38;
    result._0_8_ = local_88.u._4_8_;
    uVar2 = result._0_8_;
    result.u.addr6.addr[1] = local_88.u.addr6.addr[3];
    local_38._4_4_ = local_88.u._0_4_;
    local_38 = auVar1;
    result._0_8_ = uVar2;
    if ((local_38._4_4_ != 0x22000000) ||
       (result.ver = (lrtr_ip_version)local_88.u._4_8_, result.ver != LRTR_IPV4)) {
      __assert_fail("result.u.addr6.addr[0] == 0x22000000 && result.u.addr6.addr[1] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_getbits.c"
                    ,0x72,"void get_bits_testv6(void)");
    }
    lrtr_ip_addr_get_bits(&local_9c,(lrtr_ip_addr *)((long)&result.u + 8),'@','\b');
    local_38 = (undefined1  [8])local_9c._0_8_;
    result._0_8_ = local_9c.u._4_8_;
    uVar2 = result._0_8_;
    result.u.addr6.addr[1] = local_9c.u.addr6.addr[3];
    result.ver = (lrtr_ip_version)local_9c.u._4_8_;
    result._0_8_ = uVar2;
    if ((result.ver != LRTR_IPV4) ||
       (result.u.addr6.addr[0] = (uint32_t)((ulong)local_9c.u._4_8_ >> 0x20),
       result.u.addr6.addr[0] != 0x33000000)) {
      __assert_fail("result.u.addr6.addr[1] == 0 && result.u.addr6.addr[2] == 0x33000000",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_getbits.c"
                    ,0x75,"void get_bits_testv6(void)");
    }
    lrtr_ip_addr_get_bits(&local_b0,(lrtr_ip_addr *)((long)&result.u + 8),'\a','\b');
    local_38 = (undefined1  [8])local_b0._0_8_;
    auVar1 = local_38;
    result._0_8_ = local_b0.u._4_8_;
    uVar2 = result._0_8_;
    result.u.addr6.addr[1] = local_b0.u.addr6.addr[3];
    local_38._4_4_ = local_b0.u._0_4_;
    local_38 = auVar1;
    result._0_8_ = uVar2;
    if ((local_38._4_4_ != 0xaa0000) ||
       (result.ver = (lrtr_ip_version)local_b0.u._4_8_, result.ver != LRTR_IPV4)) {
      __assert_fail("result.u.addr6.addr[0] == 0xAA0000 && result.u.addr6.addr[1] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_getbits.c"
                    ,0x78,"void get_bits_testv6(void)");
    }
    lrtr_ip_addr_get_bits
              ((lrtr_ip_addr *)(buf + 0x2c),(lrtr_ip_addr *)((long)&result.u + 8),'D','\a');
    local_38 = (undefined1  [8])stack0xffffffffffffff3c;
    auVar1 = local_38;
    local_38._4_4_ = (undefined4)((ulong)stack0xffffffffffffff3c >> 0x20);
    local_38 = auVar1;
    if ((local_38._4_4_ == 0) &&
       (result.u.addr6.addr[0] = (uint32_t)((ulong)local_bc >> 0x20),
       result.u.addr6.addr[0] == 0x3000000)) {
      lrtr_ip_str_to_addr("fe80::862b:2bff:fe9a:f50f",(lrtr_ip_addr *)((long)&result.u + 8));
      result.u.addr6.addr[2] = 1;
      if (result.u.addr6.addr[3] == 0xfe800000) {
        __assert_fail("addr.u.addr6.addr[1] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_getbits.c"
                      ,0x82,"void get_bits_testv6(void)");
      }
      __assert_fail("addr.u.addr6.addr[0] == 0xfe800000",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_getbits.c"
                    ,0x81,"void get_bits_testv6(void)");
    }
    __assert_fail("result.u.addr6.addr[0] == 0 && result.u.addr6.addr[2] == 0x03000000",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_getbits.c"
                  ,0x7b,"void get_bits_testv6(void)");
  }
  __assert_fail("result.u.addr6.addr[3] == addr.u.addr6.addr[3]",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_getbits.c"
                ,0x6f,"void get_bits_testv6(void)");
}

Assistant:

static void get_bits_testv6(void)
{
	struct lrtr_ip_addr addr;
	struct lrtr_ip_addr result;

	addr.ver = LRTR_IPV6;
	addr.u.addr6.addr[0] = 0x22AABBCC;
	addr.u.addr6.addr[1] = 0xDDEEFF99;
	addr.u.addr6.addr[2] = 0x33001122;
	addr.u.addr6.addr[3] = 0x33445566;

	result = lrtr_ip_addr_get_bits(&addr, 0, 128);
	assert(result.u.addr6.addr[0] == addr.u.addr6.addr[0] && result.u.addr6.addr[1] == addr.u.addr6.addr[1] &&
	       result.u.addr6.addr[2] == addr.u.addr6.addr[2] && result.u.addr6.addr[3] == addr.u.addr6.addr[3]);

	result = lrtr_ip_addr_get_bits(&addr, 0, 64);
	assert(result.u.addr6.addr[0] == addr.u.addr6.addr[0] && result.u.addr6.addr[1] == addr.u.addr6.addr[1] &&
	       result.u.addr6.addr[2] == 0 && result.u.addr6.addr[3] == 0);

	bzero(&result, sizeof(result));
	result = lrtr_ip_addr_get_bits(&addr, 64, 64);
	assert(result.u.addr6.addr[0] == 0);
	assert(result.u.addr6.addr[1] == 0);
	assert(result.u.addr6.addr[2] == addr.u.addr6.addr[2]);
	assert(result.u.addr6.addr[3] == addr.u.addr6.addr[3]);

	result = lrtr_ip_addr_get_bits(&addr, 0, 8);
	assert(result.u.addr6.addr[0] == 0x22000000 && result.u.addr6.addr[1] == 0);

	result = lrtr_ip_addr_get_bits(&addr, 64, 8);
	assert(result.u.addr6.addr[1] == 0 && result.u.addr6.addr[2] == 0x33000000);

	result = lrtr_ip_addr_get_bits(&addr, 7, 8);
	assert(result.u.addr6.addr[0] == 0xAA0000 && result.u.addr6.addr[1] == 0);

	result = lrtr_ip_addr_get_bits(&addr, 68, 7);
	assert(result.u.addr6.addr[0] == 0 && result.u.addr6.addr[2] == 0x03000000);

	char buf[INET6_ADDRSTRLEN];

	lrtr_ip_str_to_addr("fe80::862b:2bff:fe9a:f50f", &addr);
	addr.ver = LRTR_IPV6;
	assert(addr.u.addr6.addr[0] == 0xfe800000);
	assert(addr.u.addr6.addr[1] == 0);
	assert(addr.u.addr6.addr[2] == 0x862b2bff);
	assert(addr.u.addr6.addr[3] == 0xfe9af50f);

	assert(lrtr_ip_str_to_addr("2001::", &addr) == 0);
	assert(addr.u.addr6.addr[0] == 0x20010000);
	assert(addr.u.addr6.addr[1] == 0);
	assert(addr.u.addr6.addr[2] == 0);
	assert(addr.u.addr6.addr[3] == 0);

	assert(lrtr_ip_addr_to_str(&addr, buf, sizeof(buf)) == 0);
	assert(strcmp("2001::", buf) == 0);

	lrtr_ip_str_to_addr("2001:0db8:85a3:08d3:1319:8a2e:0370:7344", &addr);
	assert(lrtr_ip_addr_to_str(&addr, buf, sizeof(buf)) == 0);
	assert(strcmp("2001:db8:85a3:8d3:1319:8a2e:370:7344", buf) == 0);

	result = lrtr_ip_addr_get_bits(&addr, 0, 16);
	assert(lrtr_ip_addr_to_str(&result, buf, sizeof(buf)) == 0);
	assert(lrtr_ip_str_cmp(&result, "2001::"));

	result = lrtr_ip_addr_get_bits(&addr, 16, 16);
	assert(lrtr_ip_addr_to_str(&result, buf, sizeof(buf)) == 0);
	assert(lrtr_ip_str_cmp(&result, "0:db8::"));
	result = lrtr_ip_addr_get_bits(&addr, 0, 1);
	assert(lrtr_ip_str_cmp(&result, "::"));

	result = lrtr_ip_addr_get_bits(&addr, 126, 1);
	assert(lrtr_ip_addr_to_str(&result, buf, sizeof(buf)) == 0);
	assert(lrtr_ip_str_cmp(&result, "::"));
}